

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O0

VarSet * __thiscall libDAI::VarSet::operator|=(VarSet *this,Var *n)

{
  bool bVar1;
  iterator __first;
  reference this_00;
  size_t sVar2;
  Var *in_RSI;
  VarSet *in_RDI;
  value_type *in_stack_00000038;
  iterator pos;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffffa8;
  bool local_41;
  Var *in_stack_ffffffffffffffc8;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffffd0;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> local_18
  ;
  Var *local_10;
  
  local_10 = in_RSI;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffffa8);
  __first = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffffa8);
  local_18 = std::
             lower_bound<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::Var>
                       (__first._M_current,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                      *)in_RDI,
                     (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                      *)in_stack_ffffffffffffffa8);
  local_41 = true;
  if (!bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              ::operator*(&local_18);
    local_41 = Var::operator!=(this_00,local_10);
  }
  if (local_41 != false) {
    __gnu_cxx::
    __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
    __normal_iterator<libDAI::Var*>
              ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                *)in_RDI,
               (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                *)in_stack_ffffffffffffffa8);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::insert
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)pos._M_current,(const_iterator)n
               ,in_stack_00000038);
    sVar2 = Var::states(local_10);
    in_RDI->_statespace = sVar2 * in_RDI->_statespace;
  }
  return in_RDI;
}

Assistant:

VarSet& operator|= ( const Var& n ) {
                std::vector<Var>::iterator pos = lower_bound( _vars.begin(), _vars.end(), n );
                if( pos == _vars.end() || *pos != n ) { // insert it
                    _vars.insert( pos, n );
                    _statespace *= n.states();
                }
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
                return *this;
            }